

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::
ParseFrom<(google::protobuf::MessageLite::ParseFlags)3,google::protobuf::internal::BoundedZCIS>
          (MessageLite *this,BoundedZCIS *input)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  MessageLite *msg;
  ParseFlags in_R9D;
  BoundedZCIS input_00;
  MessageLite local_30;
  MessageLite *local_20;
  
  (*this->_vptr_MessageLite[2])();
  iVar2 = (*this->_vptr_MessageLite[4])(this);
  if (CONCAT44(extraout_var,iVar2) == 0) {
    ParseFrom<(google::protobuf::MessageLite::ParseFlags)3,google::protobuf::internal::BoundedZCIS>
              (&local_30);
  }
  else {
    msg = *(MessageLite **)(CONCAT44(extraout_var,iVar2) + 8);
    if (msg != (MessageLite *)0x0) goto LAB_002f89a6;
  }
  ParseFrom<(google::protobuf::MessageLite::ParseFlags)3,google::protobuf::internal::BoundedZCIS>();
  msg = local_20;
LAB_002f89a6:
  input_00.zcis = (ZeroCopyInputStream *)(ulong)(uint)input->limit;
  input_00._8_8_ = this;
  bVar1 = internal::MergeFromImpl<false>
                    ((internal *)input->zcis,input_00,msg,(TcParseTableBase *)0x3,in_R9D);
  return bVar1;
}

Assistant:

bool MessageLite::ParseFrom(const T& input) {
  if (flags & kParse) Clear();
  constexpr bool alias = (flags & kMergeWithAliasing) != 0;
  const internal::TcParseTableBase* tc_table;
  PROTOBUF_ALWAYS_INLINE_CALL tc_table = GetTcParseTable();
  return internal::MergeFromImpl<alias>(input, this, tc_table, flags);
}